

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Slot_Demon * __thiscall Am_Demon_Set::Get_Slot_Demon(Am_Demon_Set *this,unsigned_short which_bit)

{
  Am_Demon_Set_Data *pAVar1;
  ulong uVar2;
  Slot_Demon_Holder *pSVar3;
  
  pAVar1 = this->data;
  uVar2 = (ulong)pAVar1->invalid_length;
  if (uVar2 != 0) {
    pSVar3 = pAVar1->invalid_demons;
    do {
      if (pSVar3->which_bit == which_bit) goto LAB_001c7d18;
      pSVar3 = pSVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  uVar2 = (ulong)pAVar1->change_length;
  if (uVar2 == 0) {
    return (Am_Slot_Demon *)0x0;
  }
  pSVar3 = pAVar1->change_demons;
  while (pSVar3->which_bit != which_bit) {
    pSVar3 = pSVar3 + 1;
    uVar2 = uVar2 - 1;
    if (uVar2 == 0) {
      return (Am_Slot_Demon *)0x0;
    }
  }
LAB_001c7d18:
  return pSVar3->demon;
}

Assistant:

Am_Slot_Demon *
Am_Demon_Set::Get_Slot_Demon(unsigned short which_bit) const
{
  int i;
  for (i = 0; i < data->invalid_length; ++i)
    if (data->invalid_demons[i].which_bit == which_bit)
      return data->invalid_demons[i].demon;
  for (i = 0; i < data->change_length; ++i)
    if (data->change_demons[i].which_bit == which_bit)
      return data->change_demons[i].demon;
  return nullptr;
}